

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::hilbert_sort3
          (tetgenmesh *this,point *vertexarray,int arraysize,int e,int d,double bxmin,double bxmax,
          double bymin,double bymax,double bzmin,double bzmax,int depth)

{
  int iVar1;
  uint uVar2;
  int local_e4;
  int mask;
  int n;
  int di;
  int ei;
  int k;
  int d_w;
  int e_w;
  int w;
  int p [9];
  double z2;
  double z1;
  double y2;
  double y1;
  double x2;
  double x1;
  int depth_local;
  double bzmax_local;
  double bzmin_local;
  double bymax_local;
  double bymin_local;
  double bxmax_local;
  double bxmin_local;
  int d_local;
  int e_local;
  int arraysize_local;
  point *vertexarray_local;
  tetgenmesh *this_local;
  
  e_w = 0;
  p[6] = arraysize;
  p[2] = hilbert_split(this,vertexarray,arraysize,this->transgc[e][d][3],this->transgc[e][d][4],
                       bxmin,bxmax,bymin,bymax,bzmin,bzmax);
  p[0] = hilbert_split(this,vertexarray,p[2],this->transgc[e][d][1],this->transgc[e][d][2],bxmin,
                       bxmax,bymin,bymax,bzmin,bzmax);
  w = hilbert_split(this,vertexarray,p[0],this->transgc[e][d][0],this->transgc[e][d][1],bxmin,bxmax,
                    bymin,bymax,bzmin,bzmax);
  iVar1 = hilbert_split(this,vertexarray + p[0],p[2] - p[0],this->transgc[e][d][2],
                        this->transgc[e][d][3],bxmin,bxmax,bymin,bymax,bzmin,bzmax);
  p[1] = iVar1 + p[0];
  iVar1 = hilbert_split(this,vertexarray + p[2],p[6] - p[2],this->transgc[e][d][5],
                        this->transgc[e][d][6],bxmin,bxmax,bymin,bymax,bzmin,bzmax);
  p[4] = iVar1 + p[2];
  iVar1 = hilbert_split(this,vertexarray + p[2],p[4] - p[2],this->transgc[e][d][4],
                        this->transgc[e][d][5],bxmin,bxmax,bymin,bymax,bzmin,bzmax);
  p[3] = iVar1 + p[2];
  iVar1 = hilbert_split(this,vertexarray + p[4],p[6] - p[4],this->transgc[e][d][6],
                        this->transgc[e][d][7],bxmin,bxmax,bymin,bymax,bzmin,bzmax);
  p[5] = iVar1 + p[4];
  if ((this->b->hilbert_order < 1) || (depth + 1 != this->b->hilbert_order)) {
    for (d_w = 0; d_w < 8; d_w = d_w + 1) {
      if (this->b->hilbert_limit < (&e_w)[d_w + 1] - (&e_w)[d_w]) {
        if (d_w == 0) {
          k = 0;
        }
        else {
          uVar2 = (d_w + -1) / 2 << 1;
          k = uVar2 ^ (int)uVar2 >> 1;
        }
        if (d_w == 0) {
          ei = 0;
        }
        else {
          if (d_w % 2 == 0) {
            local_e4 = this->tsb1mod3[d_w + -1];
          }
          else {
            local_e4 = this->tsb1mod3[d_w];
          }
          ei = local_e4;
        }
        if ((this->transgc[e][d][d_w] & 1U) == 0) {
          y1 = (bxmin + bxmax) * 0.5;
          x2 = bxmin;
        }
        else {
          x2 = (bxmin + bxmax) * 0.5;
          y1 = bxmax;
        }
        if ((this->transgc[e][d][d_w] & 2U) == 0) {
          z1 = (bymin + bymax) * 0.5;
          y2 = bymin;
        }
        else {
          y2 = (bymin + bymax) * 0.5;
          z1 = bymax;
        }
        if ((this->transgc[e][d][d_w] & 4U) == 0) {
          stack0xffffffffffffff70 = (bzmin + bzmax) * 0.5;
          z2 = bzmin;
        }
        else {
          z2 = (bzmin + bzmax) * 0.5;
          stack0xffffffffffffff70 = bzmax;
        }
        hilbert_sort3(this,vertexarray + (&e_w)[d_w],(&e_w)[d_w + 1] - (&e_w)[d_w],
                      e ^ (k << ((char)d + 1U & 0x1f) | k >> (2U - (char)d & 0x1f)) & 7U,
                      (d + ei + 1) % 3,x2,y1,y2,z1,z2,stack0xffffffffffffff70,depth + 1);
      }
    }
  }
  return;
}

Assistant:

void tetgenmesh::hilbert_sort3(point* vertexarray, int arraysize, int e, int d, 
                               REAL bxmin, REAL bxmax, REAL bymin, REAL bymax, 
                               REAL bzmin, REAL bzmax, int depth)
{
  REAL x1, x2, y1, y2, z1, z2;
  int p[9], w, e_w, d_w, k, ei, di;
  int n = 3, mask = 7;

  p[0] = 0;
  p[8] = arraysize;

  // Sort the points according to the 1st order Hilbert curve in 3d.
  p[4] = hilbert_split(vertexarray, p[8], transgc[e][d][3], transgc[e][d][4], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax);
  p[2] = hilbert_split(vertexarray, p[4], transgc[e][d][1], transgc[e][d][2], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax);
  p[1] = hilbert_split(vertexarray, p[2], transgc[e][d][0], transgc[e][d][1], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax);
  p[3] = hilbert_split(&(vertexarray[p[2]]), p[4] - p[2], 
                       transgc[e][d][2], transgc[e][d][3], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax) + p[2];
  p[6] = hilbert_split(&(vertexarray[p[4]]), p[8] - p[4], 
                       transgc[e][d][5], transgc[e][d][6], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax) + p[4];
  p[5] = hilbert_split(&(vertexarray[p[4]]), p[6] - p[4], 
                       transgc[e][d][4], transgc[e][d][5], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax) + p[4];
  p[7] = hilbert_split(&(vertexarray[p[6]]), p[8] - p[6], 
                       transgc[e][d][6], transgc[e][d][7], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax) + p[6];

  if (b->hilbert_order > 0) {
    // A maximum order is prescribed. 
    if ((depth + 1) == b->hilbert_order) {
      // The maximum prescribed order is reached.
      return;
    }
  }

  // Recursively sort the points in sub-boxes.
  for (w = 0; w < 8; w++) {
    // w is the local Hilbert index (NOT Gray code).
    // Sort into the sub-box either there are more than 2 points in it, or
    //   the prescribed order of the curve is not reached yet.
    //if ((p[w+1] - p[w] > b->hilbert_limit) || (b->hilbert_order > 0)) {
    if ((p[w+1] - p[w]) > b->hilbert_limit) {
      // Calculcate the start point (ei) of the curve in this sub-box.
      //   update e = e ^ (e(w) left_rotate (d+1)).
      if (w == 0) {
        e_w = 0;
      } else {
        //   calculate e(w) = gc(2 * floor((w - 1) / 2)).
        k = 2 * ((w - 1) / 2); 
        e_w = k ^ (k >> 1); // = gc(k).
      }
      k = e_w;
      e_w = ((k << (d+1)) & mask) | ((k >> (n-d-1)) & mask);
      ei = e ^ e_w;
      // Calulcate the direction (di) of the curve in this sub-box.
      //   update d = (d + d(w) + 1) % n
      if (w == 0) {
        d_w = 0;
      } else {
        d_w = ((w % 2) == 0) ? tsb1mod3[w - 1] : tsb1mod3[w];
      }
      di = (d + d_w + 1) % n;
      // Calculate the bounding box of the sub-box.
      if (transgc[e][d][w] & 1) { // x-axis
        x1 = 0.5 * (bxmin + bxmax);
        x2 = bxmax;
      } else {
        x1 = bxmin;
        x2 = 0.5 * (bxmin + bxmax);
      }
      if (transgc[e][d][w] & 2) { // y-axis
        y1 = 0.5 * (bymin + bymax);
        y2 = bymax;
      } else {
        y1 = bymin;
        y2 = 0.5 * (bymin + bymax);
      }
      if (transgc[e][d][w] & 4) { // z-axis
        z1 = 0.5 * (bzmin + bzmax);
        z2 = bzmax;
      } else {
        z1 = bzmin;
        z2 = 0.5 * (bzmin + bzmax);
      }
      hilbert_sort3(&(vertexarray[p[w]]), p[w+1] - p[w], ei, di, 
                    x1, x2, y1, y2, z1, z2, depth+1);
    } // if (p[w+1] - p[w] > 1)
  } // w
}